

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

lyxml_ns * lyxml_ns_get(ly_set *ns_set,char *prefix,size_t prefix_len)

{
  lyd_node *plVar1;
  char *refstr;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (ulong)ns_set->count;
  if (uVar3 != 0) {
    do {
      plVar1 = (ns_set->field_2).dnodes[uVar3 - 1];
      refstr = *(char **)plVar1;
      if (prefix_len == 0 || prefix == (char *)0x0) {
        if (refstr == (char *)0x0) {
          return (lyxml_ns *)plVar1;
        }
      }
      else if ((refstr != (char *)0x0) && (iVar2 = ly_strncmp(refstr,prefix,prefix_len), iVar2 == 0)
              ) {
        return (lyxml_ns *)plVar1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return (lyxml_ns *)0x0;
}

Assistant:

const struct lyxml_ns *
lyxml_ns_get(const struct ly_set *ns_set, const char *prefix, size_t prefix_len)
{
    struct lyxml_ns *ns;
    uint32_t u;

    if (!ns_set->count) {
        return NULL;
    }

    u = ns_set->count;
    do {
        --u;
        ns = (struct lyxml_ns *)ns_set->objs[u];

        if (prefix && prefix_len) {
            if (ns->prefix && !ly_strncmp(ns->prefix, prefix, prefix_len)) {
                return ns;
            }
        } else if (!ns->prefix) {
            /* default namespace */
            return ns;
        }
    } while (u);

    return NULL;
}